

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O0

void obj_stop_timers(obj *obj)

{
  timer_element *ptVar1;
  timer_element *next_timer;
  timer_element *prev;
  timer_element *curr;
  obj *obj_local;
  
  next_timer = (timer_element *)0x0;
  prev = obj->olev->lev_timers;
  while (prev != (timer_element *)0x0) {
    ptVar1 = prev->next;
    if ((prev->kind == 2) && ((obj *)prev->arg == obj)) {
      if (next_timer == (timer_element *)0x0) {
        obj->olev->lev_timers = prev->next;
      }
      else {
        next_timer->next = prev->next;
      }
      if (timeout_funcs[prev->func_index].cleanup != (timeout_proc)0x0) {
        (*timeout_funcs[prev->func_index].cleanup)(prev->arg,(long)prev->timeout);
      }
      free(prev);
      prev = ptVar1;
    }
    else {
      next_timer = prev;
      prev = ptVar1;
    }
  }
  obj->timed = '\0';
  return;
}

Assistant:

void obj_stop_timers(struct obj *obj)
{
    timer_element *curr, *prev, *next_timer=0;

    for (prev = 0, curr = obj->olev->lev_timers; curr; curr = next_timer) {
	next_timer = curr->next;
	if (curr->kind == TIMER_OBJECT && curr->arg == obj) {
	    if (prev)
		prev->next = curr->next;
	    else
		obj->olev->lev_timers = curr->next;
	    if (timeout_funcs[curr->func_index].cleanup)
		(*timeout_funcs[curr->func_index].cleanup)(curr->arg, curr->timeout);
	    free(curr);
	} else {
	    prev = curr;
	}
    }
    obj->timed = 0;
}